

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O2

void * tommy_hashdyn_remove(tommy_hashdyn *hashdyn,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  tommy_node *node;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = hashdyn->bucket_mask & hash;
  node = (tommy_node *)(hashdyn->bucket + uVar4);
  do {
    do {
      node = node->next;
      if (node == (tommy_node *)0x0) {
        pvVar3 = (void *)0x0;
        goto LAB_00106898;
      }
    } while (node->key != hash);
    iVar2 = (*(code *)cmp)(cmp_arg,node->data);
  } while (iVar2 != 0);
  tommy_list_remove_existing(hashdyn->bucket + uVar4,node);
  hashdyn->count = hashdyn->count - 1;
  hashdyn_shrink_step(hashdyn);
  pvVar3 = node->data;
LAB_00106898:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashdyn_remove(tommy_hashdyn* hashdyn, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;
	tommy_hashdyn_node* node = hashdyn->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashdyn->bucket[pos], node);

			--hashdyn->count;

			hashdyn_shrink_step(hashdyn);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}